

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O2

void __thiscall
iDynTree::SixAxisForceTorqueSensor::~SixAxisForceTorqueSensor(SixAxisForceTorqueSensor *this)

{
  SixAxisForceTorqueSensorPrivateAttributes *this_00;
  
  (this->super_JointSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__SixAxisForceTorqueSensor_001e68e8;
  this_00 = this->pimpl;
  if (this_00 != (SixAxisForceTorqueSensorPrivateAttributes *)0x0) {
    SixAxisForceTorqueSensorPrivateAttributes::~SixAxisForceTorqueSensorPrivateAttributes(this_00);
  }
  operator_delete(this_00,0x160);
  LinkSensor::~LinkSensor((LinkSensor *)this);
  return;
}

Assistant:

SixAxisForceTorqueSensor::~SixAxisForceTorqueSensor()
{
    delete this->pimpl;
}